

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O1

string * __thiscall
MinVR::VRDisplayNode::getName_abi_cxx11_(string *__return_storage_ptr__,VRDisplayNode *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->_name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getName() const { return _name; }